

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readCStyleComment(OurReader *this,bool *containsNewLineResult)

{
  char *pcVar1;
  char *pcVar2;
  
  *containsNewLineResult = false;
  do {
    while( true ) {
      pcVar2 = this->current_;
      pcVar1 = pcVar2 + 1;
      if (this->end_ <= pcVar1) goto LAB_001236ad;
      this->current_ = pcVar1;
      if (*pcVar2 != '\n') break;
      *containsNewLineResult = true;
    }
  } while ((*pcVar2 != '*') || (pcVar2 = pcVar1, *pcVar1 != '/'));
LAB_001236ad:
  if (pcVar2 == this->end_) {
    return false;
  }
  this->current_ = pcVar2 + 1;
  return *pcVar2 == '/';
}

Assistant:

bool OurReader::readCStyleComment(bool* containsNewLineResult) {
  *containsNewLineResult = false;

  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
    if (c == '\n')
      *containsNewLineResult = true;
  }

  return getNextChar() == '/';
}